

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_rpc(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  lys_node_rpc_action *rpc;
  lys_node *child;
  int *first_local;
  lys_node *node_local;
  lyout *out_local;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((*(ushort *)&node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_typedefs
            (out,(lys_tpdf *)node[1].name,(uint8_t)*(undefined2 *)(node->padding + 2),(int *)0x0);
  jsons_print_groupings(out,node->child,(int *)0x0);
  for (rpc = (lys_node_rpc_action *)node->child; rpc != (lys_node_rpc_action *)0x0;
      rpc = (lys_node_rpc_action *)rpc->next) {
    if ((rpc->nodetype & LYS_INPUT) != LYS_UNKNOWN) {
      jsons_print_input(out,(lys_node *)rpc,(int *)0x0);
      break;
    }
  }
  rpc = (lys_node_rpc_action *)node->child;
  do {
    if (rpc == (lys_node_rpc_action *)0x0) {
LAB_001d8bf6:
      ly_print(out,"}");
      return;
    }
    if ((rpc->nodetype & LYS_OUTPUT) != LYS_UNKNOWN) {
      jsons_print_output(out,(lys_node *)rpc,(int *)0x0);
      goto LAB_001d8bf6;
    }
    rpc = (lys_node_rpc_action *)rpc->next;
  } while( true );
}

Assistant:

static void
jsons_print_rpc(struct lyout *out, const struct lys_node *node, int *first)
{
    const struct lys_node *child;
    struct lys_node_rpc_action *rpc = (struct lys_node_rpc_action *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", rpc->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", rpc->ref, 1, NULL);
    jsons_print_status(out, rpc->flags, NULL);
    jsons_print_iffeatures(out, rpc->module, rpc->iffeature, rpc->iffeature_size, NULL);
    jsons_print_typedefs(out, rpc->tpdf, rpc->tpdf_size, NULL);
    jsons_print_groupings(out, rpc->child, NULL);

    LY_TREE_FOR(node->child, child) {
        if (!(child->nodetype & LYS_INPUT)) {
            continue;
        }
        jsons_print_input(out, child, NULL);
        break;
    }

    LY_TREE_FOR(node->child, child) {
        if (!(child->nodetype & LYS_OUTPUT)) {
            continue;
        }
        jsons_print_output(out, child, NULL);
        break;
    }
    ly_print(out, "}");
}